

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::TryGetCallbackDefInstrForCallApplyTarget(Inline *this,Instr *callApplyLdInstr)

{
  code *pcVar1;
  bool bVar2;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  StackSym *callbackSym;
  undefined4 *puVar3;
  Instr *pIVar4;
  
  bVar2 = IR::Opnd::IsSymOpnd(callApplyLdInstr->m_src1);
  if (bVar2) {
    this_00 = IR::Opnd::AsSymOpnd(callApplyLdInstr->m_src1);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar2) {
      this_01 = IR::Opnd::AsPropertySymOpnd(callApplyLdInstr->m_src1);
      callbackSym = IR::PropertySymOpnd::GetObjectSym(this_01);
      if (callbackSym == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x404,"(callbackSym != nullptr)","callbackSym != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pIVar4 = TryGetCallbackDefInstr(this,callbackSym);
      return pIVar4;
    }
  }
  return (Instr *)0x0;
}

Assistant:

IR::Instr * Inline::TryGetCallbackDefInstrForCallApplyTarget(IR::Instr * callApplyLdInstr)
{
    // Try to find a function argument that could be inlined.
    if (!callApplyLdInstr->GetSrc1()->IsSymOpnd() || !callApplyLdInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return nullptr;
    }
    StackSym * callbackSym = callApplyLdInstr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym();
    Assert(callbackSym != nullptr);
    return TryGetCallbackDefInstr(callbackSym);
}